

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  Command *pCVar6;
  ulong uVar7;
  uint32_t distextra;
  uint32_t distnumextra;
  size_t dist_code;
  ulong uStack_258;
  uint8_t literal;
  size_t j;
  size_t cmd_code;
  Command cmd;
  size_t i;
  size_t pos;
  uint8_t *lit_depth_local;
  size_t n_commands_local;
  Command *commands_local;
  size_t mask_local;
  size_t start_pos_local;
  uint8_t *input_local;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v;
  uint8_t *p;
  uint64_t bits;
  uint64_t copyextraval;
  uint64_t insextraval;
  uint32_t insnumextra;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t copylen_code;
  uint64_t v_1;
  uint8_t *p_1;
  uint32_t nbits;
  ushort local_4a;
  uint32_t nbits_1;
  ushort local_22;
  
  cmd.dist_extra_ = 0;
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  i = start_pos;
  do {
    if (n_commands <= (ulong)cmd._8_8_) {
      return;
    }
    pCVar6 = commands + cmd._8_8_;
    uVar2._0_4_ = pCVar6->insert_len_;
    uVar2._4_4_ = pCVar6->copy_len_;
    uVar3._0_4_ = pCVar6->dist_extra_;
    uVar3._4_2_ = pCVar6->cmd_prefix_;
    uVar3._6_2_ = pCVar6->dist_prefix_;
    uVar7 = uVar3 >> 0x20 & 0xffff;
    bVar1 = cmd_depth[uVar7];
    if (cmd_bits[uVar7] >> (bVar1 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < (ulong)bVar1) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)cmd_bits[uVar7] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
    uVar5 = uVar2._4_4_ & 0xffffff ^ (uint)uVar2._4_4_ >> 0x18;
    uVar7 = uVar2 & 0xffffffff;
    if (uVar7 < 6) {
      local_4a = (ushort)(undefined4)uVar2;
    }
    else if (uVar7 < 0x82) {
      iVar4 = 0x1f;
      if ((undefined4)uVar2 - 2 != 0) {
        for (; (undefined4)uVar2 - 2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_4a = (short)(iVar4 + -1) * 2 + (short)(uVar7 - 2 >> ((byte)(iVar4 + -1) & 0x3f)) + 2;
    }
    else if (uVar7 < 0x842) {
      iVar4 = 0x1f;
      if ((undefined4)uVar2 - 0x42 != 0) {
        for (; (undefined4)uVar2 - 0x42 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_4a = (short)iVar4 + 10;
    }
    else if (uVar7 < 0x1842) {
      local_4a = 0x15;
    }
    else if (uVar7 < 0x5842) {
      local_4a = 0x16;
    }
    else {
      local_4a = 0x17;
    }
    uVar7 = (ulong)uVar5;
    if (uVar7 < 10) {
      local_22 = (short)uVar5 - 2;
    }
    else if (uVar7 < 0x86) {
      iVar4 = 0x1f;
      if (uVar5 - 6 != 0) {
        for (; uVar5 - 6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_22 = (short)(iVar4 + -1) * 2 + (short)(uVar7 - 6 >> ((byte)(iVar4 + -1) & 0x3f)) + 4;
    }
    else if (uVar7 < 0x846) {
      iVar4 = 0x1f;
      if (uVar5 - 0x46 != 0) {
        for (; uVar5 - 0x46 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      local_22 = (short)iVar4 + 0xc;
    }
    else {
      local_22 = 0x17;
    }
    uVar7 = (ulong)(uVar5 - kCopyBase[local_22]) << ((byte)kInsExtra[local_4a] & 0x3f) |
            (ulong)((undefined4)uVar2 - kInsBase[local_4a]);
    uVar5 = kInsExtra[local_4a] + kCopyExtra[local_22];
    if (uVar7 >> ((byte)uVar5 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < (ulong)uVar5) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         uVar7 << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)uVar5 + *storage_ix;
    for (uStack_258 = uVar2 & 0xffffffff; uStack_258 != 0; uStack_258 = uStack_258 - 1) {
      bVar1 = lit_depth[input[i & mask]];
      if (lit_bits[input[i & mask]] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)lit_bits[input[i & mask]] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      i = i + 1;
    }
    i = (uVar2._4_4_ & 0xffffff) + i;
    if (((uVar2 & 0xffffff00000000) != 0) && (0x7f < (ushort)uVar3._4_2_)) {
      bVar1 = dist_depth[uVar3 >> 0x30];
      if (dist_bits[uVar3 >> 0x30] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)dist_bits[uVar3 >> 0x30] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      if (((undefined4)uVar3 & 0xffffff) >> ((byte)((uint)(undefined4)uVar3 >> 0x18) & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)((uint)(undefined4)uVar3 >> 0x18)) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)((undefined4)uVar3 & 0xffffff) << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)((uint)(undefined4)uVar3 >> 0x18) + *storage_ix;
    }
    cmd._8_8_ = cmd._8_8_ + 1;
  } while( true );
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command *commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}